

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O1

size_t cesl_uint64_to_str(uint64_t value,char *dst_str,uint8_t base)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  char buffer [65];
  char local_48 [72];
  
  uVar5 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  sVar3 = 0;
  do {
    sVar2 = sVar3;
    cVar4 = (char)(value % uVar5);
    cVar6 = 'W';
    if (cVar4 < '\n') {
      cVar6 = '0';
    }
    local_48[sVar2] = cVar6 + cVar4;
    sVar3 = sVar2 + 1;
    bVar7 = uVar5 <= value;
    value = value / uVar5;
  } while (bVar7);
  if (0 < (long)sVar3) {
    for (pcVar1 = local_48 + sVar2 + 1; local_48 < pcVar1; pcVar1 = pcVar1 + -1) {
      *dst_str = pcVar1[-1];
      dst_str = dst_str + 1;
    }
    *dst_str = '\0';
    return sVar3;
  }
  __assert_fail("(len > 0)&&(\"cesl_uint64_to_str negative lenght\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                ,0x91,"size_t cesl_uint64_to_str(uint64_t, char *, uint8_t)");
}

Assistant:

size_t cesl_uint64_to_str(uint64_t value, char* dst_str, uint8_t base)
{
    char buffer[sizeof(uint64_t)*8+1];// be careful with the length of the buffer
    char* pos = buffer;

    while (value || pos == buffer) {
        int8_t index = (int8_t)(value % base);
        value /= base; // v/=radix uses less CPU clocks than v=v/radix does
        if (index < 10) {
            *pos = index+'0';
            ++pos;
        }
        else {
            *pos = index + 'a' - 10;
            ++pos;
        }
    }

    ptrdiff_t len = pos - buffer;
    cesl_assert(len > 0, "cesl_uint64_to_str negative lenght");

    while (pos > buffer) {
        --pos;
        *dst_str = *pos;
        ++dst_str;
    }

    *dst_str = '\0';
    return (size_t)len;
}